

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  Context *context;
  char *__s;
  Texture2DRenderCase *this_00;
  allocator<char> *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  int row;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  string descriptionBase;
  string nameBase;
  allocator<char> local_58 [16];
  undefined1 local_48 [16];
  undefined4 local_38;
  long lVar8;
  
  lVar6 = 0;
  do {
    internalFormat = (&DAT_02155ec8)[lVar6 * 4];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,(&PTR_anon_var_dwarf_4d3a45_02155ec0)[lVar6 * 2],local_58);
    __s = glu::getTextureFormatName(internalFormat);
    std::__cxx11::string::string<std::allocator<char>>((string *)&descriptionBase,__s,local_58);
    this_00 = (Texture2DRenderCase *)operator_new(0x218);
    context = (this->super_TestCaseGroup).m_context;
    local_48 = (undefined1  [16])0x0;
    local_58[0] = (allocator<char>)0x0;
    local_58[1] = (allocator<char>)0x0;
    local_58[2] = (allocator<char>)0x0;
    local_58[3] = (allocator<char>)0x0;
    local_58[4] = (allocator<char>)0x0;
    local_58[5] = (allocator<char>)0x0;
    local_58[6] = (allocator<char>)0x0;
    local_58[7] = (allocator<char>)0x0;
    local_58[8] = (allocator<char>)0x0;
    local_58[9] = (allocator<char>)0x0;
    local_58[10] = (allocator<char>)0x0;
    local_58[0xb] = (allocator<char>)0x0;
    local_58[0xc] = (allocator<char>)0x0;
    local_58[0xd] = (allocator<char>)0x0;
    local_58[0xe] = (allocator<char>)0x0;
    local_58[0xf] = (allocator<char>)0x0;
    local_38 = 0;
    lVar3 = 0;
    lVar4 = 0;
    paVar1 = local_58;
    do {
      lVar5 = 0;
      auVar7 = _DAT_019fcc00;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 != lVar5) {
            uVar10 = 0;
          }
          *(undefined4 *)(paVar1 + lVar5) = uVar10;
        }
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 + -0xc != lVar5) {
            uVar10 = 0;
          }
          *(undefined4 *)(paVar1 + lVar5 + 0xc) = uVar10;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar5 = lVar5 + 0x18;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xc;
      paVar1 = paVar1 + 4;
    } while (lVar4 != 3);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,nameBase._M_dataplus._M_p,descriptionBase._M_dataplus._M_p,
               internalFormat,0x812f,0x812f,0x2600,0x2600,(Mat3 *)local_58,1,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &nameBase.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != paVar2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
      paVar2 = extraout_RAX;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x31);
  return (int)paVar2;
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].internalFormat;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= glu::getTextureFormatName(format);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}